

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_terminate(void)

{
  ulong uVar1;
  global_array_t *pgVar2;
  proc_list_t *ppVar3;
  long lVar4;
  long lVar5;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (GAinitialized == '\x01') {
    sai_terminate_sparse_arrays();
    if (0 < _max_global_array) {
      lVar5 = 0;
      lVar4 = 0;
      pgVar2 = GA;
      do {
        if (*(int *)((long)pgVar2->dims + lVar5 + -0x28) != 0) {
          pnga_destroy(lVar4 + -1000);
          pgVar2 = GA;
        }
        if (*(void **)(pgVar2->name + lVar5 + -0x10) != (void *)0x0) {
          free(*(void **)(pgVar2->name + lVar5 + -0x10));
          pgVar2 = GA;
        }
        if (*(void **)(pgVar2->name + lVar5 + -8) != (void *)0x0) {
          free(*(void **)(pgVar2->name + lVar5 + -8));
          pgVar2 = GA;
        }
        lVar4 = lVar4 + 1;
        uVar1 = (ulong)_max_global_array;
        lVar5 = lVar5 + 0x368;
      } while (lVar4 < (long)uVar1);
      if (0 < _max_global_array) {
        lVar5 = 0x10;
        lVar4 = 0;
        ppVar3 = PGRP_LIST;
        do {
          if (*(int *)((long)ppVar3 + lVar5 + -8) != 0) {
            free(*(void **)((long)&ppVar3->mirrored + lVar5));
            uVar1 = (ulong)(uint)_max_global_array;
            ppVar3 = PGRP_LIST;
          }
          lVar4 = lVar4 + 1;
          lVar5 = lVar5 + 0x28;
        } while (lVar4 < (int)uVar1);
      }
    }
    pnga_sync();
    GA_total_memory = -1;
    GA_memory_limited = 0;
    gai_finalize_onesided();
    free(mapALL);
    free(_ga_main_data_structure);
    free(_proc_list_main_data_structure);
    ARMCI_Free(GA_Update_Flags[GAme]);
    free(GA_Update_Flags);
    ARMCI_Free_local(GA_Update_Signal);
    pnga_sync();
    ARMCI_Finalize();
    MPI_Comm_free(&GA_MPI_World_comm_dup);
    ARMCIinitialized = 0;
    GAinitialized = '\0';
  }
  return;
}

Assistant:

void pnga_terminate() 
{
    //GA_Internal_Threadsafe_Lock();
Integer i, handle;

    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(!GAinitialized)
    {
        //GA_Internal_Threadsafe_Unlock();
        return;
    }

    sai_terminate_sparse_arrays();
#ifdef PROFILE_OLD 
    ga_profile_terminate();
#endif
    for (i=0;i<_max_global_array;i++){
          handle = i - GA_OFFSET ;
          if(GA[i].actv) pnga_destroy(handle);
          if(GA[i].ptr) free(GA[i].ptr);
          if(GA[i].mapc) free(GA[i].mapc);
    }
    /* don't free groups list until all arrays destroyed */
    for (i=0;i<_max_global_array;i++){
          if(PGRP_LIST[i].actv) free(PGRP_LIST[i].map_proc_list);
    }
    pnga_sync();

    GA_total_memory = -1; /* restore "unlimited" memory usage status */
    GA_memory_limited = 0;
    gai_finalize_onesided();
    free(mapALL);
    free(_ga_main_data_structure);
    free(_proc_list_main_data_structure);
    ARMCI_Free(GA_Update_Flags[GAme]);
    free(GA_Update_Flags);
    ARMCI_Free_local(GA_Update_Signal);

    pnga_sync();
    ARMCI_Finalize();
#ifdef MSG_COMMS_MPI
    MPI_Comm_free(&GA_MPI_World_comm_dup);
#endif
    ARMCIinitialized = 0;
    GAinitialized = 0;
    //GA_Internal_Threadsafe_Unlock();
}